

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

Option * __thiscall
CLI::App::add_flag_function
          (App *this,string *name,function<void_(unsigned_long)> *function,string *description)

{
  Option *this_00;
  IncorrectConstruction *__return_storage_ptr__;
  string sStack_108;
  string local_e8;
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  local_c8;
  string local_a8;
  function<void_(unsigned_long)> local_88;
  callback_t fun;
  string local_48;
  
  std::function<void_(unsigned_long)>::function(&local_88,function);
  ::std::function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>::
  function<CLI::App::add_flag_function(std::__cxx11::string,std::function<void(unsigned_long)>,std::__cxx11::string)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)_1_,void>
            ((function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>
              *)&fun,(anon_class_32_1_3a3b9956 *)&local_88);
  std::_Function_base::~_Function_base(&local_88.super__Function_base);
  ::std::__cxx11::string::string((string *)&local_a8,(string *)name);
  std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::function(&local_c8,&fun);
  ::std::__cxx11::string::string((string *)&local_e8,(string *)description);
  this_00 = add_option(this,&local_a8,&local_c8,&local_e8,false);
  ::std::__cxx11::string::~string((string *)&local_e8);
  std::_Function_base::~_Function_base(&local_c8.super__Function_base);
  ::std::__cxx11::string::~string((string *)&local_a8);
  if ((this_00->pname_)._M_string_length == 0) {
    ::std::__cxx11::string::string((string *)&sStack_108,"",(allocator *)&local_88);
    Option::set_custom_option(this_00,&sStack_108,0);
    ::std::__cxx11::string::~string((string *)&sStack_108);
    std::_Function_base::~_Function_base(&fun.super__Function_base);
    return this_00;
  }
  __return_storage_ptr__ = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
  ::std::__cxx11::string::string((string *)&local_48,(string *)name);
  IncorrectConstruction::PositionalFlag(__return_storage_ptr__,&local_48);
  __cxa_throw(__return_storage_ptr__,&IncorrectConstruction::typeinfo,Error::~Error);
}

Assistant:

Option *add_flag_function(std::string name,
                              std::function<void(size_t)> function, ///< A function to call, void(size_t)
                              std::string description = "") {

        CLI::callback_t fun = [function](CLI::results_t res) {
            auto count = static_cast<size_t>(res.size());
            function(count);
            return true;
        };

        Option *opt = add_option(name, fun, description, false);
        if(opt->get_positional())
            throw IncorrectConstruction::PositionalFlag(name);
        opt->set_custom_option("", 0);
        return opt;
    }